

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

bool __thiscall BloomFilter::exists(BloomFilter *this,uint64_t key)

{
  ulong uVar1;
  void *in_RCX;
  uint32_t in_EDX;
  bool bVar2;
  uint hash [4];
  ulong local_28;
  ulong uStack_20;
  uint64_t local_18;
  
  local_28 = 0;
  uStack_20 = 0;
  local_18 = key;
  MurmurHash3_x64_128(&local_18,(int)&local_28,in_EDX,in_RCX);
  bVar2 = false;
  uVar1 = (local_28 & 0xffffffff) % 0x14000;
  if ((((*(ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                   (ulong)((uint)(uVar1 >> 3) & 0x3ff8)) >> (uVar1 & 0x3f) & 1) != 0) &&
      (bVar2 = false, uVar1 = (local_28 >> 0x20) % 0x14000,
      (*(ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                 (ulong)((uint)(uVar1 >> 3) & 0x3ff8)) >> (uVar1 & 0x3f) & 1) != 0)) &&
     (bVar2 = false, uVar1 = (uStack_20 & 0xffffffff) % 0x14000,
     (*(ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                (ulong)((uint)(uVar1 >> 3) & 0x3ff8)) >> (uVar1 & 0x3f) & 1) != 0)) {
    uVar1 = (uStack_20 >> 0x20) % 0x14000;
    bVar2 = (*(ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                       (ulong)((uint)(uVar1 >> 3) & 0x3ff8)) >> (uVar1 & 0x3f) & 1) != 0;
  }
  return bVar2;
}

Assistant:

bool BloomFilter::exists(uint64_t key) const {
  unsigned int hash[4] = {0};
  MurmurHash3_x64_128(&key, sizeof(key), 1, &hash);
  return bits[hash[0] % (10240 * 8)] && bits[hash[1] % (10240 * 8)] &&
         bits[hash[2] % (10240 * 8)] && bits[hash[3] % (10240 * 8)];
}